

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::TextureUploadCase::init(TextureUploadCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  ShaderProgram *pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  TestError *this_00;
  uint rowPitch;
  char *__end;
  long lVar7;
  string fragmentShaderSource;
  string vertexShaderSource;
  TextureFormat local_138;
  int maxTextureSize;
  Vec4 local_128;
  undefined1 *local_110;
  undefined1 *puStack_108;
  ProgramSources sources;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x868))(0xd33,&maxTextureSize);
  if (maxTextureSize < this->m_texSize) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Unsupported texture size");
    paVar6 = extraout_RAX;
  }
  else {
    vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&vertexShaderSource,0x1b3c1e9,0x1b3c1e9);
    fragmentShaderSource._M_dataplus._M_p = (pointer)&fragmentShaderSource.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fragmentShaderSource,0x1b3c1e9,0x1b3c1e9);
    std::__cxx11::string::append((char *)&vertexShaderSource);
    std::__cxx11::string::append((char *)&fragmentShaderSource);
    pSVar5 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    sources._193_8_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&sources,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(sources.sources,&vertexShaderSource);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(sources.sources + 1,&fragmentShaderSource);
    glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx,&sources);
    this->m_program = pSVar5;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sources.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&sources.attribLocationBindings);
    lVar7 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&sources.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    pSVar5 = this->m_program;
    if ((pSVar5->m_program).m_info.linkOk == false) {
      glu::operator<<(this->m_log,pSVar5);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to create shader program (m_programRender)",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pTextureUploadTests.cpp"
                 ,0xb6);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x1680))((pSVar5->m_program).m_program);
    (**(code **)(lVar4 + 0x1a00))(0,0,0x40,0x40);
    (**(code **)(lVar4 + 0x4e8))(0xb71);
    (**(code **)(lVar4 + 0x4e8))(0xb44);
    (**(code **)(lVar4 + 0x5e0))(0xbe2);
    (**(code **)(lVar4 + 0x120))(1,1);
    (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar4 + 0x188))(0x4000);
    uVar2 = (**(code **)(lVar4 + 0xb48))((this->m_program->m_program).m_program,"u_sampler");
    uVar3 = (**(code **)(lVar4 + 0x780))((this->m_program->m_program).m_program,"a_pos");
    (**(code **)(lVar4 + 0x610))(uVar3);
    (**(code **)(lVar4 + 0x19f0))(uVar3,2,0x1406,0,0,quadCoords);
    (**(code **)(lVar4 + 0x14f0))(uVar2,0);
    (**(code **)(lVar4 + 8))(0x84c0);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture);
    (**(code **)(lVar4 + 0xb8))(0xde1,this->m_texture);
    (**(code **)(lVar4 + 0xff0))(0xcf5,this->m_alignment);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,0x812f);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,0x812f);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2601);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2601);
    local_138 = glu::mapGLTransferFormat(this->m_format,this->m_type);
    iVar1 = tcu::TextureFormat::getPixelSize(&local_138);
    rowPitch = -this->m_alignment & (iVar1 * this->m_texSize + this->m_alignment) - 1U;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_texData,(long)(int)(this->m_texSize * rowPitch));
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&sources,&local_138,this->m_texSize,this->m_texSize,1,rowPitch,0
               ,(this->m_texData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start);
    local_128.m_data[0] = 0.0;
    local_128.m_data[1] = 0.0;
    local_128.m_data[2] = 0.0;
    local_128.m_data[3] = 0.0;
    local_110 = &DAT_3f8000003f800000;
    puStack_108 = &DAT_3f8000003f800000;
    tcu::fillWithComponentGradients((PixelBufferAccess *)&sources,&local_128,(Vec4 *)&local_110);
    (**(code **)(lVar4 + 0x1310))
              (0xde1,0,this->m_format,this->m_texSize,this->m_texSize,0,this->m_format,this->m_type,
               (this->m_texData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    (**(code **)(lVar4 + 0x538))(5,0,4);
    (**(code **)(lVar4 + 0x648))();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fragmentShaderSource._M_dataplus._M_p != &fragmentShaderSource.field_2) {
      operator_delete(fragmentShaderSource._M_dataplus._M_p,
                      fragmentShaderSource.field_2._M_allocated_capacity + 1);
    }
    paVar6 = &vertexShaderSource.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vertexShaderSource._M_dataplus._M_p != paVar6) {
      operator_delete(vertexShaderSource._M_dataplus._M_p,
                      vertexShaderSource.field_2._M_allocated_capacity + 1);
      paVar6 = extraout_RAX_00;
    }
  }
  return (int)paVar6;
}

Assistant:

void TextureUploadCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	int maxTextureSize;
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

	if (m_texSize > maxTextureSize)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported texture size");
		return;
	}

	// Create program

	string vertexShaderSource = "";
	string fragmentShaderSource = "";

	vertexShaderSource.append(	"precision mediump	float;\n"
								"attribute vec2		a_pos;\n"
								"varying   vec2		v_texCoord;\n"
								"\n"
								"void main (void)\n"
								"{\n"
								"	v_texCoord	= a_pos;\n"
								"	gl_Position = vec4(a_pos, 0.5, 1.0);\n"
								"}\n");

	fragmentShaderSource.append("precision	mediump	float;\n"
								"uniform	lowp sampler2D	u_sampler;\n"
								"varying	vec2			v_texCoord;\n"
								"\n"
								"void main (void)\n"
								"{\n"
								"	gl_FragColor = texture2D(u_sampler, v_texCoord.xy);\n"
								"}\n");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		TCU_FAIL("Failed to create shader program (m_programRender)");
	}

	gl.useProgram (m_program->getProgram());

	// Init GL state

	gl.viewport		(0, 0, VIEWPORT_SIZE, VIEWPORT_SIZE);
	gl.disable		(GL_DEPTH_TEST);
	gl.disable		(GL_CULL_FACE);
	gl.enable		(GL_BLEND);
	gl.blendFunc	(GL_ONE, GL_ONE);
	gl.clearColor	(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear		(GL_COLOR_BUFFER_BIT);

	deUint32 uSampler	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");
	deUint32 aPos		= gl.getAttribLocation (m_program->getProgram(), "a_pos");
	gl.enableVertexAttribArray	(aPos);
	gl.vertexAttribPointer		(aPos,	2, GL_FLOAT, GL_FALSE, 0, &quadCoords[0]);
	gl.uniform1i				(uSampler, 0);

	// Create texture

	gl.activeTexture	(GL_TEXTURE0);
	gl.genTextures		(1, &m_texture);
	gl.bindTexture		(GL_TEXTURE_2D, m_texture);
	gl.pixelStorei		(GL_UNPACK_ALIGNMENT, m_alignment);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

	// Prepare texture data

	{
		const tcu::TextureFormat&	texFmt		= glu::mapGLTransferFormat(m_format, m_type);
		int							pixelSize	= texFmt.getPixelSize();
		int							stride		= deAlign32(pixelSize*m_texSize, m_alignment);

		m_texData.resize(stride*m_texSize);

		tcu::PixelBufferAccess		access		(texFmt, m_texSize, m_texSize, 1, stride, 0, &m_texData[0]);

		tcu::fillWithComponentGradients(access, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	}

	// Do a dry-run to ensure the pipes are hot

	gl.texImage2D	(GL_TEXTURE_2D, 0, m_format, m_texSize, m_texSize, 0, m_format, m_type, &m_texData[0]);
	gl.drawArrays	(GL_TRIANGLE_STRIP, 0, 4);
	gl.finish		();
}